

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SequenceRepetitionSyntax *pSVar1;
  DeepCloneVisitor visitor;
  Token local_50;
  Token local_40;
  Token local_30;
  SyntaxNode *local_20;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x38) == (SyntaxNode *)0x0) {
    local_20 = (SyntaxNode *)0x0;
  }
  else {
    local_20 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_30,
                          (BumpAllocator *)__child_stack);
  }
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SequenceRepetitionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SelectorSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,&local_50,
                      (SelectorSyntax **)&local_20,&local_30);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SequenceRepetitionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SequenceRepetitionSyntax>(
        node.openBracket.deepClone(alloc),
        node.op.deepClone(alloc),
        node.selector ? deepClone(*node.selector, alloc) : nullptr,
        node.closeBracket.deepClone(alloc)
    );
}